

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

PgHdr1 * pcache1FetchStage2(PCache1 *pCache,uint iKey,int createFlag)

{
  int iVar1;
  PGroup *pPVar2;
  PCache1 *pPVar3;
  PgHdr1 *pPVar4;
  PgHdr1 **ppPVar5;
  int iVar6;
  u64 uVar7;
  int *piVar8;
  void *pvVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  PgHdr1 **ppPVar13;
  u64 n;
  PgHdr1 *pPVar14;
  
  pPVar2 = pCache->pGroup;
  if (createFlag == 1) {
    uVar12 = pCache->nPage - pCache->nRecyclable;
    if ((pPVar2->mxPinned <= uVar12) || (pCache->n90pct <= uVar12)) {
      return (PgHdr1 *)0x0;
    }
    if ((pcache1_g.nSlot == 0) || (pcache1_g.szSlot < pCache->szExtra + pCache->szPage)) {
      piVar8 = &mem0.nearlyFull;
    }
    else {
      piVar8 = &pcache1_g.bUnderPressure;
    }
    if (*piVar8 != 0 && pCache->nRecyclable < uVar12) {
      return (PgHdr1 *)0x0;
    }
  }
  if (pCache->nHash <= pCache->nPage) {
    pcache1ResizeHash(pCache);
  }
  iVar1 = pCache->bPurgeable;
  if ((iVar1 == 0) || (pPVar14 = (pPVar2->lru).pLruPrev, pPVar14->isAnchor != 0)) {
LAB_001a0755:
    pPVar14 = (PgHdr1 *)0x0;
  }
  else {
    if (pCache->nPage + 1 < pCache->nMax) {
      if ((pcache1_g.nSlot == 0) || (pcache1_g.szSlot < pCache->szExtra + pCache->szPage)) {
        piVar8 = &mem0.nearlyFull;
      }
      else {
        piVar8 = &pcache1_g.bUnderPressure;
      }
      if (*piVar8 == 0) goto LAB_001a0755;
    }
    pPVar3 = pPVar14->pCache;
    ppPVar5 = pPVar3->apHash + (ulong)pPVar14->iKey % (ulong)pPVar3->nHash;
    do {
      ppPVar13 = ppPVar5;
      pPVar4 = *ppPVar13;
      ppPVar5 = &pPVar4->pNext;
    } while (pPVar4 != pPVar14);
    *ppPVar13 = *ppPVar5;
    pPVar3->nPage = pPVar3->nPage - 1;
    pPVar4 = pPVar14->pLruPrev;
    pPVar4->pLruNext = pPVar14->pLruNext;
    pPVar14->pLruNext->pLruPrev = pPVar4;
    pPVar14->pLruNext = (PgHdr1 *)0x0;
    pPVar3 = pPVar14->pCache;
    pPVar3->nRecyclable = pPVar3->nRecyclable - 1;
    if (pPVar3->szAlloc != pCache->szAlloc) {
      pcache1FreePage(pPVar14);
      goto LAB_001a0755;
    }
    pPVar2->nPurgeable = pPVar2->nPurgeable + (iVar1 - pPVar3->bPurgeable);
  }
  if (pPVar14 != (PgHdr1 *)0x0) goto LAB_001a0977;
  if (pCache->pFree == (PgHdr1 *)0x0) {
    if (((pCache->nPage == 0) && (pcache1_g.nInitPage != 0)) && (2 < pCache->nMax)) {
      if (sqlite3Hooks_0 != (code *)0x0) {
        (*sqlite3Hooks_0)();
      }
      lVar11 = (long)pcache1_g.nInitPage;
      if (lVar11 < 1) {
        uVar7 = lVar11 * -0x400;
      }
      else {
        uVar7 = pCache->szAlloc * lVar11;
      }
      n = (ulong)pCache->nMax * (long)pCache->szAlloc;
      if ((long)uVar7 < (long)n) {
        n = uVar7;
      }
      pvVar9 = sqlite3Malloc(n);
      pCache->pBulk = pvVar9;
      if (sqlite3Hooks_1 != (code *)0x0) {
        (*sqlite3Hooks_1)();
      }
      if (pvVar9 != (void *)0x0) {
        iVar6 = (*sqlite3Config.m.xSize)(pvVar9);
        iVar1 = pCache->szAlloc;
        uVar10 = (long)iVar6 / (long)iVar1 & 0xffffffff;
        lVar11 = (long)pCache->szPage;
        pPVar14 = pCache->pFree;
        do {
          *(void **)((long)pvVar9 + lVar11) = pvVar9;
          *(long *)((long)pvVar9 + lVar11 + 8) = (long)pvVar9 + lVar11 + 0x38;
          *(undefined4 *)((long)pvVar9 + lVar11 + 0x14) = 1;
          *(PgHdr1 **)((long)pvVar9 + lVar11 + 0x18) = pPVar14;
          pPVar14 = (PgHdr1 *)((long)pvVar9 + lVar11);
          *(undefined8 *)((long)pvVar9 + lVar11 + 0x30) = 0;
          pvVar9 = (void *)((long)pvVar9 + (long)iVar1);
          uVar12 = (int)uVar10 - 1;
          uVar10 = (ulong)uVar12;
        } while (uVar12 != 0);
        pCache->pFree = (PgHdr1 *)((long)pvVar9 + (lVar11 - iVar1));
      }
      if (pCache->pFree != (PgHdr1 *)0x0) goto LAB_001a0768;
    }
    if ((createFlag == 1) && (sqlite3Hooks_0 != (code *)0x0)) {
      (*sqlite3Hooks_0)();
    }
    pvVar9 = pcache1Alloc(pCache->szAlloc);
    iVar1 = pCache->szPage;
    if ((createFlag == 1) && (sqlite3Hooks_1 != (code *)0x0)) {
      (*sqlite3Hooks_1)();
    }
    if (pvVar9 == (void *)0x0) {
      pPVar14 = (PgHdr1 *)0x0;
      goto LAB_001a0977;
    }
    pPVar14 = (PgHdr1 *)((long)iVar1 + (long)pvVar9);
    (pPVar14->page).pBuf = pvVar9;
    (pPVar14->page).pExtra = pPVar14 + 1;
    pPVar14->isBulkLocal = 0;
    pPVar14->isAnchor = 0;
  }
  else {
LAB_001a0768:
    pPVar14 = pCache->pFree;
    pCache->pFree = pPVar14->pNext;
    pPVar14->pNext = (PgHdr1 *)0x0;
  }
  *pCache->pnPurgeable = *pCache->pnPurgeable + 1;
LAB_001a0977:
  if (pPVar14 != (PgHdr1 *)0x0) {
    uVar10 = (ulong)iKey % (ulong)pCache->nHash;
    pCache->nPage = pCache->nPage + 1;
    pPVar14->iKey = iKey;
    pPVar14->pNext = pCache->apHash[uVar10];
    pPVar14->pCache = pCache;
    pPVar14->pLruNext = (PgHdr1 *)0x0;
    *(undefined8 *)(pPVar14->page).pExtra = 0;
    pCache->apHash[uVar10] = pPVar14;
    if (pCache->iMaxKey < iKey) {
      pCache->iMaxKey = iKey;
    }
  }
  return pPVar14;
}

Assistant:

static SQLITE_NOINLINE PgHdr1 *pcache1FetchStage2(
  PCache1 *pCache, 
  unsigned int iKey, 
  int createFlag
){
  unsigned int nPinned;
  PGroup *pGroup = pCache->pGroup;
  PgHdr1 *pPage = 0;

  /* Step 3: Abort if createFlag is 1 but the cache is nearly full */
  assert( pCache->nPage >= pCache->nRecyclable );
  nPinned = pCache->nPage - pCache->nRecyclable;
  assert( pGroup->mxPinned == pGroup->nMaxPage + 10 - pGroup->nMinPage );
  assert( pCache->n90pct == pCache->nMax*9/10 );
  if( createFlag==1 && (
        nPinned>=pGroup->mxPinned
     || nPinned>=pCache->n90pct
     || (pcache1UnderMemoryPressure(pCache) && pCache->nRecyclable<nPinned)
  )){
    return 0;
  }

  if( pCache->nPage>=pCache->nHash ) pcache1ResizeHash(pCache);
  assert( pCache->nHash>0 && pCache->apHash );

  /* Step 4. Try to recycle a page. */
  if( pCache->bPurgeable
   && !pGroup->lru.pLruPrev->isAnchor
   && ((pCache->nPage+1>=pCache->nMax) || pcache1UnderMemoryPressure(pCache))
  ){
    PCache1 *pOther;
    pPage = pGroup->lru.pLruPrev;
    assert( PAGE_IS_UNPINNED(pPage) );
    pcache1RemoveFromHash(pPage, 0);
    pcache1PinPage(pPage);
    pOther = pPage->pCache;
    if( pOther->szAlloc != pCache->szAlloc ){
      pcache1FreePage(pPage);
      pPage = 0;
    }else{
      pGroup->nPurgeable -= (pOther->bPurgeable - pCache->bPurgeable);
    }
  }

  /* Step 5. If a usable page buffer has still not been found, 
  ** attempt to allocate a new one. 
  */
  if( !pPage ){
    pPage = pcache1AllocPage(pCache, createFlag==1);
  }

  if( pPage ){
    unsigned int h = iKey % pCache->nHash;
    pCache->nPage++;
    pPage->iKey = iKey;
    pPage->pNext = pCache->apHash[h];
    pPage->pCache = pCache;
    pPage->pLruNext = 0;
    /* pPage->pLruPrev = 0;
    ** No need to clear pLruPrev since it is not accessed when pLruNext==0 */
    *(void **)pPage->page.pExtra = 0;
    pCache->apHash[h] = pPage;
    if( iKey>pCache->iMaxKey ){
      pCache->iMaxKey = iKey;
    }
  }
  return pPage;
}